

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

int __thiscall
glslang::TReflectionTraverser::countAggregateMembers(TReflectionTraverser *this,TType *parentType)

{
  EShReflectionOptions EVar1;
  TTypeList *pTVar2;
  TType *parentType_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  pointer pTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar4 = (*parentType->_vptr_TType[0x25])(parentType);
  iVar9 = 1;
  if ((char)iVar4 != '\0') {
    EVar1 = this->reflection->options;
    iVar4 = (*parentType->_vptr_TType[7])(parentType);
    bVar11 = true;
    if (iVar4 == 0x10) {
      iVar4 = (*parentType->_vptr_TType[0xb])(parentType);
      bVar11 = (*(uint *)(CONCAT44(extraout_var,iVar4) + 8) & 0x7f) != 6;
    }
    iVar4 = (*parentType->_vptr_TType[0x25])(parentType);
    if ((char)iVar4 == '\0') {
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    pTVar2 = (parentType->field_13).structure;
    pTVar7 = (pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((pTVar2->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish == pTVar7) {
      iVar9 = 0;
    }
    else {
      lVar8 = 0;
      uVar10 = 0;
      iVar9 = 0;
      do {
        parentType_00 = *(TType **)((long)&pTVar7->type + lVar8);
        iVar4 = countAggregateMembers(this,parentType_00);
        iVar5 = (*parentType_00->_vptr_TType[0x1d])(parentType_00);
        if ((char)iVar5 != '\0') {
          iVar5 = (*parentType_00->_vptr_TType[0x13])(parentType_00);
          uVar6 = TSmallArrayVector::frontSize((TSmallArrayVector *)CONCAT44(extraout_var_00,iVar5))
          ;
          if (((uVar6 != 0) &&
              (bVar3 = TArraySizes::isInnerUnsized((TArraySizes *)CONCAT44(extraout_var_00,iVar5)),
              !bVar3)) &&
             (iVar5 = (*parentType_00->_vptr_TType[0x25])(parentType_00),
             (byte)((byte)iVar5 &
                   ((EVar1 & EShReflectionStrictArraySuffix) == EShReflectionDefault | bVar11)) == 1
             )) {
            iVar5 = (*parentType_00->_vptr_TType[0x13])(parentType_00);
            iVar5 = TArraySizes::getCumulativeSize((TArraySizes *)CONCAT44(extraout_var_01,iVar5));
            iVar4 = iVar4 * iVar5;
          }
        }
        iVar9 = iVar9 + iVar4;
        uVar10 = uVar10 + 1;
        pTVar7 = (pTVar2->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x20;
      } while (uVar10 < (ulong)((long)(pTVar2->
                                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ).
                                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 5
                               ));
    }
  }
  return iVar9;
}

Assistant:

int countAggregateMembers(const TType& parentType)
    {
        if (! parentType.isStruct())
            return 1;

        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        bool blockParent = (parentType.getBasicType() == EbtBlock && parentType.getQualifier().storage == EvqBuffer);

        const TTypeList &memberList = *parentType.getStruct();

        int ret = 0;

        for (size_t i = 0; i < memberList.size(); i++)
        {
            const TType &memberType = *memberList[i].type;
            int numMembers = countAggregateMembers(memberType);
            // for sized arrays of structs, apply logic to expand out the same as we would below in
            // blowUpActiveAggregate
            if (memberType.isArray() && ! memberType.getArraySizes()->hasUnsized() && memberType.isStruct()) {
                if (! strictArraySuffix || ! blockParent)
                    numMembers *= memberType.getArraySizes()->getCumulativeSize();
            }
            ret += numMembers;
        }

        return ret;
    }